

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

void nni_http_del_header(nng_http *conn,char *key)

{
  _Bool _Var1;
  nni_list *local_28;
  nni_list *hdrs;
  char *key_local;
  nng_http *conn_local;
  
  if ((conn->client & 1U) == 0) {
    local_28 = &(conn->res).data.hdrs;
  }
  else {
    local_28 = &(conn->req).data.hdrs;
  }
  do {
    _Var1 = http_del_header_one(local_28,key);
  } while (_Var1);
  return;
}

Assistant:

void
nni_http_del_header(nng_http *conn, const char *key)
{
	nni_list *hdrs =
	    conn->client ? &conn->req.data.hdrs : &conn->res.data.hdrs;
	while (http_del_header_one(hdrs, key)) {
		continue;
	}
}